

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

Program * UnifiedRegex::Program::New(Recycler *recycler,RegexFlags flags)

{
  Recycler *alloc;
  Program *this;
  TrackAllocData local_40;
  RegexFlags local_11;
  Recycler *pRStack_10;
  RegexFlags flags_local;
  Recycler *recycler_local;
  
  local_11 = flags;
  pRStack_10 = recycler;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
             ,0x162b);
  alloc = Memory::Recycler::TrackAllocInfo(recycler,&local_40);
  this = (Program *)new<Memory::Recycler>(0x38,alloc,0x43c4b0);
  Program(this,local_11);
  return this;
}

Assistant:

Program *Program::New(Recycler *recycler, RegexFlags flags)
    {
        return RecyclerNew(recycler, Program, flags);
    }